

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

vec3 polyscope::view::screenCoordsToWorldPosition(vec2 screenCoords)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float fVar11;
  float fVar12;
  float fVar13;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vec3 vVar25;
  mat4 projInv;
  mat4 viewInv;
  mat4 view;
  mat4 proj;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  mat<4,_4,_float,_(glm::qualifier)0> local_a8;
  mat<4,_4,_float,_(glm::qualifier)0> local_60;
  undefined1 extraout_var [56];
  
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = screenCoords;
  fVar11 = (float)bufferWidth;
  fVar12 = (float)windowWidth;
  auVar8 = vmovshdup_avx(auVar9._0_16_);
  fVar5 = (float)bufferHeight;
  fVar13 = (float)windowHeight;
  local_a8.value[0]._0_8_ = _viewMat;
  local_a8.value[0]._8_8_ = DAT_006006ac;
  local_a8.value[1]._0_8_ = DAT_006006b4;
  local_a8.value[1]._8_8_ = _DAT_006006bc;
  local_a8.value[2]._0_8_ = DAT_006006c4;
  local_a8.value[2]._8_8_ = DAT_006006cc;
  local_a8.value[3]._0_8_ = DAT_006006d4;
  local_a8.value[3]._8_8_ = DAT_006006dc;
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_a8);
  getCameraPerspectiveMatrix();
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_60);
  auVar10._0_8_ =
       (**(code **)(**(long **)(render::engine + 0xd0) + 0x68))
                 (*(long **)(render::engine + 0xd0),
                  (int)((screenCoords.field_0.x * fVar11) / fVar12),
                  (int)((float)bufferHeight - (auVar8._0_4_ * fVar5) / fVar13));
  auVar10._8_56_ = extraout_var;
  if (((float)auVar10._0_8_ != 1.0) || (NAN((float)auVar10._0_8_))) {
    fVar5 = screenCoords.field_0.x / (float)windowWidth;
    fVar11 = 1.0 - auVar8._0_4_ / (float)windowHeight;
    auVar8 = vfmadd132ss_fma(auVar10._0_16_,SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40000000));
    fVar5 = fVar5 + fVar5 + -1.0;
    fVar11 = fVar11 + fVar11 + -1.0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_108;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_100;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_f8;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_f0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_e8;
    fVar12 = auVar8._0_4_;
    auVar16._0_4_ =
         (float)local_148 * fVar5 + (float)local_138 * fVar11 +
         (float)local_118 + fVar12 * (float)local_128;
    auVar16._4_4_ =
         (float)((ulong)local_148 >> 0x20) * fVar5 + (float)((ulong)local_138 >> 0x20) * fVar11 +
         (float)((ulong)local_118 >> 0x20) + fVar12 * (float)((ulong)local_128 >> 0x20);
    auVar16._8_4_ = fVar5 * 0.0 + fVar11 * 0.0 + fVar12 * 0.0 + 0.0;
    auVar16._12_4_ = fVar5 * 0.0 + fVar11 * 0.0 + fVar12 * 0.0 + 0.0;
    auVar7._0_4_ = fVar5 * (float)local_140 + fVar11 * (float)local_130 +
                   (float)local_110 + (float)local_120 * fVar12;
    auVar7._4_4_ = fVar5 * (float)((ulong)local_140 >> 0x20) +
                   fVar11 * (float)((ulong)local_130 >> 0x20) +
                   (float)((ulong)local_110 >> 0x20) + (float)((ulong)local_120 >> 0x20) * fVar12;
    auVar7._8_4_ = fVar5 * 0.0 + fVar11 * 0.0 + fVar12 * 0.0 + 0.0;
    auVar7._12_4_ = fVar5 * 0.0 + fVar11 * 0.0 + fVar12 * 0.0 + 0.0;
    auVar15 = vmovshdup_avx(auVar7);
    auVar8 = vdivps_avx(auVar16,auVar15);
    auVar15 = vdivps_avx(auVar7,auVar15);
    fVar5 = auVar8._0_4_;
    auVar1 = vmovshdup_avx(auVar8);
    auVar7 = vinsertps_avx(auVar20,auVar19,0x4c);
    auVar19 = vshufps_avx(auVar8,auVar8,0xe1);
    auVar16 = vinsertps_avx(auVar18,auVar21,0x4c);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_e0;
    auVar2 = vmulss_avx512f(auVar15,auVar4);
    auVar18 = vmovshdup_avx(auVar15);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_d8;
    auVar3 = vmulss_avx512f(auVar18,auVar23);
    auVar20 = vinsertps_avx512f(auVar23,auVar4,0x4c);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_d0;
    auVar4 = vmulss_avx512f(auVar18,auVar24);
    auVar18 = vshufps_avx(auVar15,auVar15,0xe1);
    auVar21 = vinsertps_avx512f(auVar22,auVar24,0x4c);
    auVar17._0_4_ =
         fVar5 * auVar7._0_4_ + auVar16._0_4_ * auVar19._0_4_ +
         auVar15._0_4_ * auVar20._0_4_ + auVar18._0_4_ * auVar21._0_4_;
    auVar17._4_4_ =
         auVar8._4_4_ * auVar7._4_4_ + auVar16._4_4_ * auVar19._4_4_ +
         auVar15._4_4_ * auVar20._4_4_ + auVar18._4_4_ * auVar21._4_4_;
    auVar17._8_4_ =
         auVar8._8_4_ * auVar7._8_4_ + auVar16._8_4_ * auVar19._8_4_ +
         auVar15._8_4_ * auVar20._8_4_ + auVar18._8_4_ * auVar21._8_4_;
    auVar17._12_4_ =
         auVar8._12_4_ * auVar7._12_4_ + auVar16._12_4_ * auVar19._12_4_ +
         auVar15._12_4_ * auVar20._12_4_ + auVar18._12_4_ * auVar21._12_4_;
    auVar8._4_12_ = auVar17._4_12_;
    auVar8._0_4_ = (float)local_108 * fVar5 + (float)local_f8 * auVar1._0_4_ +
                   (float)local_e8 * auVar15._0_4_ + auVar3._0_4_;
    auVar15._4_4_ = auVar17._0_4_;
    auVar15._0_4_ = auVar17._0_4_;
    auVar15._8_4_ = auVar17._0_4_;
    auVar15._12_4_ = auVar17._0_4_;
    auVar8 = vdivps_avx(auVar8,auVar15);
    uVar6 = auVar8._0_8_;
    aVar14.z = ((float)local_100 * fVar5 + (float)local_f0 * auVar1._0_4_ +
               auVar2._0_4_ + auVar4._0_4_) / auVar17._0_4_;
  }
  else {
    aVar14.z = INFINITY;
    uVar6 = 0x7f8000007f800000;
  }
  vVar25.field_2.z = aVar14.z;
  vVar25.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar6;
  vVar25.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar6 >> 0x20);
  return vVar25;
}

Assistant:

glm::vec3 screenCoordsToWorldPosition(glm::vec2 screenCoords) {

  glm::vec2 bufferCoords{screenCoords.x * static_cast<float>(view::bufferWidth) / static_cast<float>(view::windowWidth),
                         screenCoords.y * static_cast<float>(view::bufferHeight) /
                             static_cast<float>(view::windowHeight)};

  glm::mat4 view = getCameraViewMatrix();
  glm::mat4 viewInv = glm::inverse(view);
  glm::mat4 proj = getCameraPerspectiveMatrix();
  glm::mat4 projInv = glm::inverse(proj);
  // glm::vec2 depthRange = {0., 1.}; // no support for nonstandard depth range, currently

  // query the depth buffer to get depth
  render::FrameBuffer* sceneFramebuffer = render::engine->sceneBuffer.get();
  float depth = sceneFramebuffer->readDepth(bufferCoords.x, view::bufferHeight - bufferCoords.y);
  if (depth == 1.) {
    // if we didn't hit anything in the depth buffer, just return infinity
    float inf = std::numeric_limits<float>::infinity();
    return glm::vec3{inf, inf, inf};
  }

  // convert depth to world units
  glm::vec2 screenPos{screenCoords.x / static_cast<float>(view::windowWidth),
                      1.f - screenCoords.y / static_cast<float>(view::windowHeight)};
  float z = depth * 2.0f - 1.0f;
  glm::vec4 clipPos = glm::vec4(screenPos * 2.0f - 1.0f, z, 1.0f);
  glm::vec4 viewPos = projInv * clipPos;
  viewPos /= viewPos.w;

  glm::vec4 worldPos = viewInv * viewPos;
  worldPos /= worldPos.w;

  return glm::vec3(worldPos);
}